

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O2

void duckdb::TemplatedRadixScatter<unsigned_int>
               (UnifiedVectorFormat *vdata,SelectionVector *sel,idx_t add_count,
               data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,idx_t offset)

{
  uint uVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  data_ptr_t pdVar4;
  bool bVar5;
  long lVar6;
  idx_t iVar7;
  idx_t i;
  idx_t iVar8;
  undefined3 in_register_00000089;
  
  pdVar2 = vdata->data;
  if (CONCAT31(in_register_00000089,has_null) == 0) {
    for (iVar8 = 0; iVar8 != add_count; iVar8 = iVar8 + 1) {
      iVar7 = iVar8;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar7 = (idx_t)sel->sel_vector[iVar8];
      }
      psVar3 = vdata->sel->sel_vector;
      if (psVar3 != (sel_t *)0x0) {
        iVar7 = (idx_t)psVar3[iVar7];
      }
      uVar1 = *(uint *)(pdVar2 + iVar7 * 4 + offset * 4);
      *(uint *)key_locations[iVar8] =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      if (desc) {
        for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
          key_locations[iVar8][lVar6] = ~key_locations[iVar8][lVar6];
        }
      }
      key_locations[iVar8] = key_locations[iVar8] + 4;
    }
  }
  else {
    for (iVar8 = 0; iVar8 != add_count; iVar8 = iVar8 + 1) {
      iVar7 = iVar8;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar7 = (idx_t)sel->sel_vector[iVar8];
      }
      psVar3 = vdata->sel->sel_vector;
      if (psVar3 != (sel_t *)0x0) {
        iVar7 = (idx_t)psVar3[iVar7];
      }
      bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,
                         iVar7 + offset);
      if (bVar5) {
        *key_locations[iVar8] = nulls_first;
        uVar1 = *(uint *)(pdVar2 + (iVar7 + offset) * 4);
        *(uint *)(key_locations[iVar8] + 1) =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        if (desc) {
          for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
            key_locations[iVar8][lVar6 + 1] = ~key_locations[iVar8][lVar6 + 1];
          }
        }
      }
      else {
        *key_locations[iVar8] = !nulls_first;
        pdVar4 = key_locations[iVar8];
        pdVar4[1] = '\0';
        pdVar4[2] = '\0';
        pdVar4[3] = '\0';
        pdVar4[4] = '\0';
      }
      key_locations[iVar8] = key_locations[iVar8] + 5;
    }
  }
  return;
}

Assistant:

void TemplatedRadixScatter(UnifiedVectorFormat &vdata, const SelectionVector &sel, idx_t add_count,
                           data_ptr_t *key_locations, const bool desc, const bool has_null, const bool nulls_first,
                           const idx_t offset) {
	auto source = UnifiedVectorFormat::GetData<T>(vdata);
	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write validity and according value
			if (validity.RowIsValid(source_idx)) {
				key_locations[i][0] = valid;
				Radix::EncodeData<T>(key_locations[i] + 1, source[source_idx]);
				// invert bits if desc
				if (desc) {
					for (idx_t s = 1; s < sizeof(T) + 1; s++) {
						*(key_locations[i] + s) = ~*(key_locations[i] + s);
					}
				}
			} else {
				key_locations[i][0] = invalid;
				memset(key_locations[i] + 1, '\0', sizeof(T));
			}
			key_locations[i] += sizeof(T) + 1;
		}
	} else {
		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write value
			Radix::EncodeData<T>(key_locations[i], source[source_idx]);
			// invert bits if desc
			if (desc) {
				for (idx_t s = 0; s < sizeof(T); s++) {
					*(key_locations[i] + s) = ~*(key_locations[i] + s);
				}
			}
			key_locations[i] += sizeof(T);
		}
	}
}